

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlOutputBufferWriteWSNonSig(xmlSaveCtxtPtr ctxt,int extra)

{
  int local_2c;
  int local_18;
  int i;
  int extra_local;
  xmlSaveCtxtPtr ctxt_local;
  
  if ((ctxt != (xmlSaveCtxtPtr)0x0) && (ctxt->buf != (xmlOutputBufferPtr)0x0)) {
    xmlOutputBufferWrite(ctxt->buf,1,"\n");
    for (local_18 = 0; local_18 < ctxt->level + extra; local_18 = ctxt->indent_nr + local_18) {
      if (ctxt->indent_nr < (ctxt->level + extra) - local_18) {
        local_2c = ctxt->indent_nr;
      }
      else {
        local_2c = (ctxt->level + extra) - local_18;
      }
      xmlOutputBufferWrite(ctxt->buf,ctxt->indent_size * local_2c,ctxt->indent);
    }
  }
  return;
}

Assistant:

static void
xmlOutputBufferWriteWSNonSig(xmlSaveCtxtPtr ctxt, int extra)
{
    int i;
    if ((ctxt == NULL) || (ctxt->buf == NULL))
        return;
    xmlOutputBufferWrite(ctxt->buf, 1, "\n");
    for (i = 0; i < (ctxt->level + extra); i += ctxt->indent_nr) {
        xmlOutputBufferWrite(ctxt->buf, ctxt->indent_size *
                ((ctxt->level + extra - i) > ctxt->indent_nr ?
                 ctxt->indent_nr : (ctxt->level + extra - i)),
                ctxt->indent);
    }
}